

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_lpf_uninit(ma_lpf *pLPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ulong uVar1;
  long lVar2;
  
  if (pLPF != (ma_lpf *)0x0) {
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < pLPF->lpf1Count; uVar1 = uVar1 + 1) {
      ma_lpf1_uninit((ma_lpf1 *)((long)&pLPF->pLPF1->format + lVar2),pAllocationCallbacks);
      lVar2 = lVar2 + 0x28;
    }
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < pLPF->lpf2Count; uVar1 = uVar1 + 1) {
      ma_lpf2_uninit((ma_lpf2 *)((long)&(pLPF->pLPF2->bq).format + lVar2),pAllocationCallbacks);
      lVar2 = lVar2 + 0x40;
    }
    if (pLPF->_ownsHeap != 0) {
      ma_free(pLPF->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_lpf_uninit(ma_lpf* pLPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;

    if (pLPF == NULL) {
        return;
    }

    for (ilpf1 = 0; ilpf1 < pLPF->lpf1Count; ilpf1 += 1) {
        ma_lpf1_uninit(&pLPF->pLPF1[ilpf1], pAllocationCallbacks);
    }

    for (ilpf2 = 0; ilpf2 < pLPF->lpf2Count; ilpf2 += 1) {
        ma_lpf2_uninit(&pLPF->pLPF2[ilpf2], pAllocationCallbacks);
    }

    if (pLPF->_ownsHeap) {
        ma_free(pLPF->_pHeap, pAllocationCallbacks);
    }
}